

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmBitFieldDn<(moira::Instr)137,(moira::Mode)8,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  u32 uVar1;
  Syntax SVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  char *pcVar9;
  char cVar10;
  byte bVar11;
  Dn dn;
  uint uVar12;
  Ea<(moira::Mode)8,_4> result;
  u32 local_44;
  ushort local_40;
  uint local_3c;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar4 = (*this->_vptr_Moira[6])();
  if (((short)uVar4 < 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)137,(moira::Mode)8,4>(this,str,addr,op);
    return;
  }
  uVar12 = uVar4 & 0xffff;
  local_40 = op & 7;
  uVar3 = uVar12 >> 6;
  uVar5 = uVar3 & 0x1f;
  s = &str->ptr;
  cVar10 = 'b';
  lVar8 = 1;
  do {
    pcVar9 = *s;
    *s = pcVar9 + 1;
    *pcVar9 = cVar10;
    cVar10 = "bfextu"[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 7);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar9 = *s;
    *s = pcVar9 + 1;
    *pcVar9 = ' ';
  }
  else {
    iVar6 = (str->tab).raw;
    pcVar9 = str->ptr;
    do {
      str->ptr = pcVar9 + 1;
      *pcVar9 = ' ';
      pcVar9 = str->ptr;
    } while (pcVar9 < str->base + iVar6);
  }
  local_44 = *addr;
  *addr = local_44 + 2;
  iVar6 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  uVar7 = (*this->_vptr_Moira[6])(this);
  local_3c = uVar7 & 0xffff | iVar6 << 0x10;
  StrWriter::operator<<(str,(Ea<(moira::Mode)8,_4> *)&local_44);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    uVar7 = uVar4 & 0x820;
    pcVar9 = *s;
    *s = pcVar9 + 1;
    *pcVar9 = ',';
    if (uVar7 < 0x800) {
      if (uVar7 != 0) {
        sprintd_signed(s,(ulong)uVar5);
LAB_003cacac:
        pcVar9 = str->ptr;
        str->ptr = pcVar9 + 1;
        *pcVar9 = ',';
        StrWriter::operator<<(str,(Dn)(uVar4 & 7));
        goto LAB_003cad26;
      }
      sprintd_signed(s,(ulong)uVar5);
      pcVar9 = *s;
      *s = pcVar9 + 1;
    }
    else {
      if (uVar7 != 0x800) {
        StrWriter::operator<<(str,(Dn)(uVar3 & 7));
        goto LAB_003cacac;
      }
      StrWriter::operator<<(str,(Dn)(uVar3 & 7));
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
    }
    *pcVar9 = ',';
    sprintd_signed(s,(ulong)(uVar4 & 0x1f));
    goto LAB_003cad26;
  }
  bVar11 = 0x20;
  if ((uVar4 & 0x1f) != 0) {
    bVar11 = (byte)uVar12 & 0x1f;
  }
  uVar4 = uVar4 & 0x820;
  if (uVar4 < 0x800) {
    if (uVar4 != 0) {
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = ' ';
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = '{';
      sprintd_signed(s,(ulong)uVar5);
LAB_003cacf8:
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = ':';
      dn.raw._1_3_ = 0;
      dn.raw._0_1_ = bVar11 & 7;
      StrWriter::operator<<(str,dn);
      goto LAB_003cad17;
    }
    pcVar9 = *s;
    *s = pcVar9 + 1;
    *pcVar9 = ' ';
    pcVar9 = *s;
    *s = pcVar9 + 1;
    *pcVar9 = '{';
    sprintd_signed(s,(ulong)uVar5);
    pcVar9 = *s;
    *s = pcVar9 + 1;
    *pcVar9 = ':';
    sprintd_signed(s,(ulong)bVar11);
    pcVar9 = *s;
    *s = pcVar9 + 1;
  }
  else {
    if (uVar4 != 0x800) {
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = ' ';
      pcVar9 = str->ptr;
      str->ptr = pcVar9 + 1;
      *pcVar9 = '{';
      StrWriter::operator<<(str,(Dn)(uVar3 & 7));
      goto LAB_003cacf8;
    }
    pcVar9 = str->ptr;
    str->ptr = pcVar9 + 1;
    *pcVar9 = ' ';
    pcVar9 = str->ptr;
    str->ptr = pcVar9 + 1;
    *pcVar9 = '{';
    StrWriter::operator<<(str,(Dn)(uVar3 & 7));
    pcVar9 = str->ptr;
    str->ptr = pcVar9 + 1;
    *pcVar9 = ':';
    sprintd_signed(s,(ulong)bVar11);
LAB_003cad17:
    pcVar9 = str->ptr;
    str->ptr = pcVar9 + 1;
  }
  *pcVar9 = '}';
LAB_003cad26:
  pcVar9 = str->ptr;
  str->ptr = pcVar9 + 1;
  *pcVar9 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar9 = *s;
    *s = pcVar9 + 1;
    *pcVar9 = ' ';
  }
  StrWriter::operator<<(str,(Dn)(uVar12 >> 0xc & 7));
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar10 = ';';
    lVar8 = 1;
    do {
      pcVar9 = *s;
      *s = pcVar9 + 1;
      *pcVar9 = cVar10;
      cVar10 = "trap%-2s  ; (2+)"[lVar8 + 10];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmBitFieldDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word>(addr);
    auto dst = _____________xxx(op);
    auto o   = _____xxxxx______(ext);
    auto w   = ___________xxxxx(ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << str.tab;

    if constexpr (I == Instr::BFINS) {
        str << Dn ( _xxx____________(ext) ) << Sep{};
    }

    str << Op<M, S>(dst, addr);

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (ext & 0x0820) {

                case 0x0000: str << "," << o << "," << w; break;
                case 0x0020: str << "," << o << "," << Dn{w&7}; break;
                case 0x0800: str << "," << Dn{o&7} << "," << w; break;
                case 0x0820: str << "," << Dn{o&7} << "," << Dn{w&7}; break;
            }
            break;

        default:

            if (w == 0) w = 32;

            switch (ext & 0x0820) {

                case 0x0000: str << " {" << o << ":" << w << "}"; break;
                case 0x0020: str << " {" << o << ":" << Dn{w&7} << "}"; break;
                case 0x0800: str << " {" << Dn{o&7} << ":" << w << "}"; break;
                case 0x0820: str << " {" << Dn{o&7} << ":" << Dn{w&7} << "}"; break;
            }
    }

    if constexpr (I == Instr::BFEXTU || I == Instr::BFEXTS || I == Instr::BFFFO) {
        str << Sep{} << Dn ( _xxx____________(ext) );
    }
    str << Av<I, M, S>{};
}